

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomSignalPdu.cpp
# Opt level: O0

void __thiscall DIS::IntercomSignalPdu::marshal(IntercomSignalPdu *this,DataStream *dataStream)

{
  bool bVar1;
  size_type sVar2;
  reference puVar3;
  uchar *byte;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  DataStream *dataStream_local;
  IntercomSignalPdu *this_local;
  
  RadioCommunicationsFamilyPdu::marshal(&this->super_RadioCommunicationsFamilyPdu,dataStream);
  EntityID::marshal(&this->_entityID,dataStream);
  DataStream::operator<<(dataStream,this->_communicationsDeviceID);
  DataStream::operator<<(dataStream,this->_encodingScheme);
  DataStream::operator<<(dataStream,this->_tdlType);
  DataStream::operator<<(dataStream,this->_sampleRate);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_data);
  DataStream::operator<<(dataStream,(unsigned_short)sVar2);
  DataStream::operator<<(dataStream,this->_samples);
  __end1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->_data);
  byte = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->_data);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&byte);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&__end1);
    DataStream::operator<<(dataStream,*puVar3);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void IntercomSignalPdu::marshal(DataStream &dataStream) const {
  RadioCommunicationsFamilyPdu::marshal(
      dataStream); // Marshal information in superclass first
  _entityID.marshal(dataStream);
  dataStream << _communicationsDeviceID;
  dataStream << _encodingScheme;
  dataStream << _tdlType;
  dataStream << _sampleRate;
  dataStream << (unsigned short)_data.size();
  dataStream << _samples;

  for (auto &byte : _data) {
    dataStream << byte;
  }
}